

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_result_from_pulse(wchar_t result)

{
  ma_result local_c;
  wchar_t result_local;
  
  if (result < L'\0') {
    local_c = MA_ERROR;
  }
  else {
    switch(result) {
    case L'\0':
      local_c = MA_SUCCESS;
      break;
    case L'\x01':
      local_c = MA_ACCESS_DENIED;
      break;
    case L'\x02':
      local_c = MA_INVALID_ARGS;
      break;
    default:
      local_c = MA_ERROR;
      break;
    case L'\x05':
      local_c = MA_NO_DEVICE;
    }
  }
  return local_c;
}

Assistant:

static ma_result ma_result_from_pulse(int result)
{
    if (result < 0) {
        return MA_ERROR;
    }

    switch (result) {
        case MA_PA_OK:           return MA_SUCCESS;
        case MA_PA_ERR_ACCESS:   return MA_ACCESS_DENIED;
        case MA_PA_ERR_INVALID:  return MA_INVALID_ARGS;
        case MA_PA_ERR_NOENTITY: return MA_NO_DEVICE;
        default:                 return MA_ERROR;
    }
}